

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O0

void Extra_BitMatrixTransposePP(Vec_Ptr_t *vSimsIn,int nWordsIn,Vec_Wrd_t *vSimsOut,int nWordsOut)

{
  int iVar1;
  word *pwVar2;
  void *pvVar3;
  int local_234;
  int local_230;
  int x;
  int y;
  int i;
  word *pM [64];
  int nWordsOut_local;
  Vec_Wrd_t *vSimsOut_local;
  int nWordsIn_local;
  Vec_Ptr_t *vSimsIn_local;
  
  pM[0x3f]._4_4_ = nWordsOut;
  iVar1 = Vec_PtrSize(vSimsIn);
  if (iVar1 != pM[0x3f]._4_4_ << 6) {
    __assert_fail("Vec_PtrSize(vSimsIn) == 64 * nWordsOut",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0xa6f,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
  }
  iVar1 = Vec_WrdSize(vSimsOut);
  if (iVar1 == pM[0x3f]._4_4_ * 0x40 * nWordsIn) {
    for (local_234 = 0; local_234 < pM[0x3f]._4_4_; local_234 = local_234 + 1) {
      for (local_230 = 0; local_230 < nWordsIn; local_230 = local_230 + 1) {
        for (x = 0; x < 0x40; x = x + 1) {
          pwVar2 = Vec_WrdEntryP(vSimsOut,((local_230 * 0x40 + 0x3f) - x) * pM[0x3f]._4_4_ +
                                          local_234);
          *(word **)(&y + (long)x * 2) = pwVar2;
          pvVar3 = Vec_PtrEntry(vSimsIn,(local_234 * 0x40 + 0x3f) - x);
          **(undefined8 **)(&y + (long)x * 2) = *(undefined8 *)((long)pvVar3 + (long)local_230 * 8);
        }
        Extra_Transpose64p((word **)&y);
      }
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0xa70,"void Extra_BitMatrixTransposePP(Vec_Ptr_t *, int, Vec_Wrd_t *, int)");
}

Assistant:

void Extra_BitMatrixTransposePP( Vec_Ptr_t * vSimsIn, int nWordsIn, Vec_Wrd_t * vSimsOut, int nWordsOut )
{    
    word * pM[64];  int i, y, x;
    assert( Vec_PtrSize(vSimsIn)  == 64 * nWordsOut );
    assert( Vec_WrdSize(vSimsOut) == 64 * nWordsOut * nWordsIn  );
    for ( x = 0; x < nWordsOut; x++ )
    for ( y = 0; y < nWordsIn;  y++ )
    {
        for ( i = 0; i < 64; i++ )
        {
            pM[i]    = Vec_WrdEntryP( vSimsOut, (64*y+63-i)*nWordsOut + x );
            pM[i][0] = ((word *)Vec_PtrEntry( vSimsIn, 64*x+63-i ))[y];
        }
        Extra_Transpose64p( pM );
    }
}